

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::TestClosing(ColladaParser *this,char *pName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  char *local_1b0;
  string local_1a8;
  ostringstream local_188 [376];
  
  local_1b0 = pName;
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 2) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),local_1b0);
    if (iVar1 == 0) {
      return;
    }
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if ((iVar1 == 3) && (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 == '\0')) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,"Unexpected end of file while reading end of <",0x2d);
      poVar2 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          local_188,&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> element.",10);
      std::__cxx11::stringbuf::str();
      ThrowException(this,&local_1a8);
    }
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar1 == 2) {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),local_1b0);
      if (iVar1 == 0) {
        return;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Expected end of <",0x11);
    poVar2 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_188,&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> element.",10);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1a8);
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Unexpected end of file while reading end of <",0x2d);
  poVar2 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_188
                      ,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> element.",10);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1a8);
}

Assistant:

void ColladaParser::TestClosing(const char* pName)
{
    // check if we're already on the closing tag and return right away
    if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END && strcmp(mReader->getNodeName(), pName) == 0)
        return;

    // if not, read some more
    if (!mReader->read())
        ThrowException(format() << "Unexpected end of file while reading end of <" << pName << "> element.");
    // whitespace in front is ok, just read again if found
    if (mReader->getNodeType() == irr::io::EXN_TEXT)
        if (!mReader->read())
            ThrowException(format() << "Unexpected end of file while reading end of <" << pName << "> element.");

    // but this has the be the closing tag, or we're lost
    if (mReader->getNodeType() != irr::io::EXN_ELEMENT_END || strcmp(mReader->getNodeName(), pName) != 0)
        ThrowException(format() << "Expected end of <" << pName << "> element.");
}